

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_stack.h
# Opt level: O0

zt_stack_t * zt_stack_pop(zt_stack_t *stack)

{
  int iVar1;
  zt_elist_t *in_RDI;
  zt_stack_t *elt;
  zt_stack_t *local_8;
  
  iVar1 = zt_elist_empty(in_RDI);
  if (iVar1 == 0) {
    local_8 = in_RDI->next;
    zt_elist_remove((zt_elist_t *)0x146fe9);
  }
  else {
    local_8 = (zt_stack_t *)0x0;
  }
  return local_8;
}

Assistant:

static INLINE zt_stack_t *
zt_stack_pop(zt_stack_t *stack)
{
    zt_stack_t * elt;

    if(zt_stack_empty(stack)) {
        return NULL;
    }

    elt = zt_elist_get_next(stack);
    zt_elist_remove(elt);
    return (elt);
}